

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

char * skip_idf(char *start,char *out_idf)

{
  char cVar1;
  char *__src;
  ushort **ppuVar2;
  char *pcStack_28;
  char c;
  char *s;
  char *out_idf_local;
  char *start_local;
  
  __src = skip_white(start);
  pcStack_28 = __src;
  if (__src == (char *)0x0) {
    start_local = (char *)0x0;
  }
  else {
    for (; (*pcStack_28 != '\0' &&
           ((ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*pcStack_28] & 0x400) != 0 ||
            (*pcStack_28 == '_')))); pcStack_28 = pcStack_28 + 1) {
    }
    cVar1 = *pcStack_28;
    *pcStack_28 = '\0';
    strncpy(out_idf,__src,0xff);
    *pcStack_28 = cVar1;
    start_local = pcStack_28;
  }
  return start_local;
}

Assistant:

static char *skip_idf(char *start, char out_idf[256])
{
    char *s;
    char c;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (isalpha(*s) || *s == '_') {
            ++s;
            continue;
        }
        break;
    }
    c = *s;
    *s = 0;
    strncpy(out_idf, start, 255);
    *s = c;
    return s;
}